

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O1

u32 __thiscall tl::calcSizeUtf32(tl *this,CStr o)

{
  byte bVar1;
  u32 uVar2;
  uint uVar3;
  int iVar4;
  
  if ((uint)this == 0) {
    return 0;
  }
  uVar3 = 0;
  uVar2 = 0;
  while( true ) {
    bVar1 = *(byte *)(o._0_8_ + (ulong)uVar3);
    iVar4 = 1;
    if (((((char)bVar1 < '\0') && (iVar4 = 2, (bVar1 & 0xe0) != 0xc0)) &&
        (iVar4 = 3, (bVar1 & 0xf0) != 0xe0)) && (iVar4 = 4, (bVar1 & 0xf8) != 0xf0)) break;
    uVar3 = uVar3 + iVar4;
    uVar2 = uVar2 + 1;
    if ((uint)this <= uVar3) {
      return uVar2;
    }
  }
  return 0xffffffff;
}

Assistant:

u32 calcSizeUtf32(CStr o)
{
    u32 size = 0;
    for(u32 i=0; i<o.size(); ) {
        if((o[i] & 0b10000000) == 0) { // 1 byte
            i++;
            size++;
        }
        else if((o[i] & 0b11100000) == 0b11000000) { // 2 bytes
            i += 2;
            size++;
        }
        else if((o[i] & 0b11110000) == 0b11100000) { // 3 bytes
            i += 3;
            size++;
        }
        else if((o[i] & 0b11111000) == 0b11110000) { // 4 bytes
            i += 4;
            size++;
        }
        else {
            return TOKEN_ERROR;
        }
    }
    return size;
}